

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

void HostGame(int i)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  char *__nptr;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int gotack [9];
  PreGamePacket packet;
  
  iVar2 = DArgs::NumArgs(Args);
  uVar4 = 2;
  if (iVar2 + -1 != i) {
    __nptr = DArgs::GetArg(Args,i + 1);
    uVar3 = atoi(__nptr);
    if (uVar3 != 0) {
      if (8 < (int)uVar3) {
        I_FatalError("You cannot host a game with %d players. The limit is currently %d.",
                     (ulong)uVar3,8);
        return;
      }
      uVar4 = uVar3;
      if (uVar3 == 1) {
        doomcom.numnodes = 1;
        doomcom.id = 0x12345678;
        doomcom.consoleplayer = 0;
        doomcom.numplayers = 1;
        netgame = false;
        multiplayer = true;
        return;
      }
    }
  }
  StartNetwork(false);
  doomcom._16_4_ = doomcom._16_4_ & 0xffff0000;
  Printf("Console player number: %d\n",0);
  doomcom.numnodes = 1;
  addterm(SendAbort,"SendAbort");
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Waiting for players",(ulong)uVar4);
  iVar2 = (*StartScreen->_vptr_FStartupScreen[9])
                    (StartScreen,Host_CheckForConnects,(long)(int)uVar4);
  if ((char)iVar2 != '\0') {
    gotack[8] = 0;
    gotack[4] = 0;
    gotack[5] = 0;
    gotack[6] = 0;
    gotack[7] = 0;
    gotack[0] = 0;
    gotack[1] = 0;
    gotack[2] = 0;
    gotack[3] = 0;
    (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Sending all here.");
    (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Done waiting",1);
    iVar2 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Host_SendAllHere,gotack);
    if ((char)iVar2 != '\0') {
      popterm();
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Go");
      packet.Fake = '0';
      packet.Message = '\a';
      for (lVar6 = 1; lVar6 < doomcom.numnodes; lVar6 = lVar6 + 1) {
        for (iVar2 = -8; iVar2 != 0; iVar2 = iVar2 + 1) {
          PreSend(&packet,2,sendaddress + lVar6);
        }
      }
      uVar5 = 0;
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Total players: %d");
      doomcom.id = 0x12345678;
      uVar1 = doomcom.numnodes;
      doomcom.numplayers = uVar1;
      if ((short)uVar1 < 1) {
        uVar1 = 0;
      }
      for (; uVar1 != uVar5; uVar5 = uVar5 + 1) {
        sendplayer[uVar5] = (BYTE)uVar5;
      }
      return;
    }
  }
  exit(0);
}

Assistant:

void HostGame (int i)
{
	PreGamePacket packet;
	int numplayers;
	int node;
	int gotack[MAXNETNODES+1];

	if ((i == Args->NumArgs() - 1) || !(numplayers = atoi (Args->GetArg(i+1))))
	{	// No player count specified, assume 2
		numplayers = 2;
	}

	if (numplayers > MAXNETNODES)
	{
		I_FatalError("You cannot host a game with %d players. The limit is currently %d.", numplayers, MAXNETNODES);
		return;
	}

	if (numplayers == 1)
	{ // Special case: Only 1 player, so don't bother starting the network
		netgame = false;
		multiplayer = true;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return;
	}

	StartNetwork (false);

	// [JC] - this computer is starting the game, therefore it should
	// be the Net Arbitrator.
	doomcom.consoleplayer = 0;
	Printf ("Console player number: %d\n", doomcom.consoleplayer);

	doomcom.numnodes = 1;

	atterm (SendAbort);

	StartScreen->NetInit ("Waiting for players", numplayers);

	// Wait for numplayers-1 different connections
	if (!StartScreen->NetLoop (Host_CheckForConnects, (void *)(intptr_t)numplayers))
	{
		exit (0);
	}

	// Now inform everyone of all machines involved in the game
	memset (gotack, 0, sizeof(gotack));
	StartScreen->NetMessage ("Sending all here.");
	StartScreen->NetInit ("Done waiting", 1);

	if (!StartScreen->NetLoop (Host_SendAllHere, (void *)gotack))
	{
		exit (0);
	}

	popterm ();

	// Now go
	StartScreen->NetMessage ("Go");
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_GO;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		// If we send the packets eight times to each guest,
		// hopefully at least one of them will get through.
		for (int i = 8; i != 0; --i)
		{
			PreSend (&packet, 2, &sendaddress[node]);
		}
	}

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;

	// On the host, each player's number is the same as its node number
	for (i = 0; i < doomcom.numnodes; ++i)
	{
		sendplayer[i] = i;
	}
}